

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

nifti_1_header * nifti_make_new_header(int *arg_dims,int arg_dtype)

{
  int iVar1;
  int local_60;
  int local_5c;
  int swapsize;
  int nbyper;
  int c;
  int dtype;
  int *dim;
  int default_dims [8];
  nifti_1_header *nhdr;
  int arg_dtype_local;
  int *arg_dims_local;
  
  dim = (int *)0x100000003;
  default_dims[0] = 1;
  default_dims[1] = 1;
  default_dims[2] = 0;
  default_dims[3] = 0;
  default_dims[4] = 0;
  default_dims[5] = 0;
  _c = (int **)arg_dims;
  if (arg_dims == (int *)0x0) {
    _c = &dim;
  }
  if (((int)*(uint *)_c < 1) || (7 < (int)*(uint *)_c)) {
    fprintf(_stderr,"** nifti_simple_hdr_with_dims: bad dim[0]=%d\n",(ulong)*(uint *)_c);
    _c = &dim;
  }
  else {
    for (swapsize = 1; swapsize <= (int)*(uint *)_c; swapsize = swapsize + 1) {
      if ((int)*(uint *)((long)_c + (long)swapsize * 4) < 1) {
        fprintf(_stderr,"** nifti_simple_hdr_with_dims: bad dim[%d]=%d\n",(ulong)(uint)swapsize,
                (ulong)*(uint *)((long)_c + (long)swapsize * 4));
        _c = &dim;
        break;
      }
    }
  }
  nbyper = arg_dtype;
  iVar1 = nifti_is_valid_datatype(arg_dtype);
  if (iVar1 == 0) {
    fprintf(_stderr,"** nifti_simple_hdr_with_dims: bad dtype %d\n",(ulong)(uint)nbyper);
    nbyper = 0x10;
  }
  if (1 < g_opts.debug) {
    fprintf(_stderr,"+d nifti_make_new_header, dim[0] = %d, datatype = %d\n",(ulong)*(uint *)_c,
            (ulong)(uint)nbyper);
  }
  default_dims._24_8_ = calloc(1,0x15c);
  if ((undefined4 *)default_dims._24_8_ == (undefined4 *)0x0) {
    fprintf(_stderr,"** nifti_make_new_header: failed to alloc hdr\n");
    arg_dims_local = (int *)0x0;
  }
  else {
    *(undefined4 *)default_dims._24_8_ = 0x15c;
    *(undefined1 *)(default_dims._24_8_ + 0x26) = 0x72;
    *(short *)(default_dims._24_8_ + 0x28) = (short)*(uint *)_c;
    *(undefined4 *)(default_dims._24_8_ + 0x4c) = 0;
    for (swapsize = 1; swapsize <= (int)*(uint *)_c; swapsize = swapsize + 1) {
      *(short *)(default_dims._24_8_ + (long)swapsize * 2 + 0x28) =
           (short)*(uint *)((long)_c + (long)swapsize * 4);
      *(undefined4 *)(default_dims._24_8_ + ((long)swapsize + 0x13) * 4) = 0x3f800000;
    }
    *(short *)(default_dims._24_8_ + 0x46) = (short)nbyper;
    nifti_datatype_sizes((int)*(short *)(default_dims._24_8_ + 0x46),&local_5c,&local_60);
    *(short *)(default_dims._24_8_ + 0x48) = (short)(local_5c << 3);
    strcpy((char *)(default_dims._24_8_ + 0x158),"n+1");
    arg_dims_local = (int *)default_dims._24_8_;
  }
  return (nifti_1_header *)arg_dims_local;
}

Assistant:

nifti_1_header * nifti_make_new_header(const int arg_dims[], int arg_dtype)
{
   nifti_1_header * nhdr;
   const int        default_dims[8] = { 3, 1, 1, 1, 0, 0, 0, 0 };
   const int      * dim;  /* either passed or default dims  */
   int              dtype; /* either passed or default dtype */
   int              c, nbyper, swapsize;

   /* if arg_dims is passed, apply it */
   if( arg_dims ) dim = arg_dims;
   else           dim = default_dims;

   /* validate dim: if there is any problem, apply default_dims */
   if( dim[0] < 1 || dim[0] > 7 ) {
      fprintf(stderr,"** nifti_simple_hdr_with_dims: bad dim[0]=%d\n",dim[0]);
      dim = default_dims;
   } else {
      for( c = 1; c <= dim[0]; c++ )
         if( dim[c] < 1 )
         {
            fprintf(stderr,
                "** nifti_simple_hdr_with_dims: bad dim[%d]=%d\n",c,dim[c]);
            dim = default_dims;
            break;
         }
   }

   /* validate dtype, too */
   dtype = arg_dtype;
   if( ! nifti_is_valid_datatype(dtype) ) {
      fprintf(stderr,"** nifti_simple_hdr_with_dims: bad dtype %d\n",dtype);
      dtype = DT_FLOAT32;
   }

   /* now populate the header struct */

   if( g_opts.debug > 1 )
      fprintf(stderr,"+d nifti_make_new_header, dim[0] = %d, datatype = %d\n",
              dim[0], dtype);

   nhdr = (nifti_1_header *)calloc(1,sizeof(nifti_1_header));
   if( !nhdr ){
      fprintf(stderr,"** nifti_make_new_header: failed to alloc hdr\n");
      return NULL;
   }

   nhdr->sizeof_hdr = sizeof(nifti_1_header) ;
   nhdr->regular    = 'r' ;           /* for some stupid reason */

   /* init dim and pixdim */
   nhdr->dim[0] = dim[0] ;
   nhdr->pixdim[0] = 0.0f;
   for( c = 1; c <= dim[0]; c++ ) {
      nhdr->dim[c] = dim[c];
      nhdr->pixdim[c] = 1.0f;
   }

   nhdr->datatype = dtype ;
   nifti_datatype_sizes( nhdr->datatype , &nbyper, &swapsize );
   nhdr->bitpix   = 8 * nbyper ;

   strcpy(nhdr->magic, "n+1");  /* init to single file */

   return nhdr;
}